

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O1

void __thiscall
TEST_MockNamedValueHandlerRepository_installMultipleComparators_Test::testBody
          (TEST_MockNamedValueHandlerRepository_installMultipleComparators_Test *this)

{
  UtestShell *pUVar1;
  MockNamedValueComparator *pMVar2;
  TestTerminator *pTVar3;
  MockNamedValueComparatorsAndCopiersRepository repository;
  TypeForTestingExpectedFunctionCallComparator comparator3;
  TypeForTestingExpectedFunctionCallComparator comparator2;
  TypeForTestingExpectedFunctionCallComparator comparator1;
  SimpleString local_48;
  MockNamedValueComparatorsAndCopiersRepository local_38;
  MockNamedValueComparator local_28;
  MockNamedValueComparator local_20;
  MockNamedValueComparator local_18;
  
  local_18._vptr_MockNamedValueComparator = (_func_int **)&PTR__MockNamedValueComparator_002b7488;
  local_20._vptr_MockNamedValueComparator = (_func_int **)&PTR__MockNamedValueComparator_002b7488;
  local_28._vptr_MockNamedValueComparator = (_func_int **)&PTR__MockNamedValueComparator_002b7488;
  MockNamedValueComparatorsAndCopiersRepository::MockNamedValueComparatorsAndCopiersRepository
            (&local_38);
  SimpleString::SimpleString(&local_48,"type1");
  MockNamedValueComparatorsAndCopiersRepository::installComparator(&local_38,&local_48,&local_18);
  SimpleString::~SimpleString(&local_48);
  SimpleString::SimpleString(&local_48,"type2");
  MockNamedValueComparatorsAndCopiersRepository::installComparator(&local_38,&local_48,&local_20);
  SimpleString::~SimpleString(&local_48);
  SimpleString::SimpleString(&local_48,"type3");
  MockNamedValueComparatorsAndCopiersRepository::installComparator(&local_38,&local_48,&local_28);
  SimpleString::~SimpleString(&local_48);
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_48,"type3");
  pMVar2 = MockNamedValueComparatorsAndCopiersRepository::getComparatorForType(&local_38,&local_48);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&local_28,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x68,pTVar3);
  SimpleString::~SimpleString(&local_48);
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_48,"type2");
  pMVar2 = MockNamedValueComparatorsAndCopiersRepository::getComparatorForType(&local_38,&local_48);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&local_20,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x69,pTVar3);
  SimpleString::~SimpleString(&local_48);
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_48,"type1");
  pMVar2 = MockNamedValueComparatorsAndCopiersRepository::getComparatorForType(&local_38,&local_48);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&local_18,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x6a,pTVar3);
  SimpleString::~SimpleString(&local_48);
  MockNamedValueComparatorsAndCopiersRepository::~MockNamedValueComparatorsAndCopiersRepository
            (&local_38);
  return;
}

Assistant:

virtual bool isEqual(const void* object1, const void* object2) _override
    {
        const TypeForTestingExpectedFunctionCall* obj1 = (const TypeForTestingExpectedFunctionCall*) object1;
        const TypeForTestingExpectedFunctionCall* obj2 = (const TypeForTestingExpectedFunctionCall*) object2;
        return *(obj1->value) == *(obj2->value);
    }